

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

void FT_Outline_Translate(FT_Outline *outline,FT_Pos xOffset,FT_Pos yOffset)

{
  int iVar1;
  FT_Vector *pFVar2;
  
  if ((outline != (FT_Outline *)0x0) && (iVar1 = (int)outline->n_points, 0 < outline->n_points)) {
    pFVar2 = outline->points;
    do {
      pFVar2->x = pFVar2->x + xOffset;
      pFVar2->y = pFVar2->y + yOffset;
      pFVar2 = pFVar2 + 1;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Outline_Translate( const FT_Outline*  outline,
                        FT_Pos             xOffset,
                        FT_Pos             yOffset )
  {
    FT_UShort   n;
    FT_Vector*  vec;


    if ( !outline )
      return;

    vec = outline->points;

    for ( n = 0; n < outline->n_points; n++ )
    {
      vec->x = ADD_LONG( vec->x, xOffset );
      vec->y = ADD_LONG( vec->y, yOffset );
      vec++;
    }
  }